

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinternalmimedata.cpp
# Opt level: O3

bool QInternalMimeData::hasFormatHelper(QString *mimeType,QMimeData *data)

{
  char cVar1;
  char cVar2;
  long lVar3;
  undefined1 *puVar4;
  long in_FS_OFFSET;
  QStringView QVar5;
  QLatin1String QVar6;
  QStringView QVar7;
  QLatin1String QVar8;
  QArrayDataPointer<QString> local_58;
  QArrayDataPointer<QByteArray> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = (**(code **)(*(long *)data + 0x60))(data,mimeType);
  cVar2 = '\x01';
  if (cVar1 == '\0') {
    if (((mimeType->d).size == 0x16) &&
       (QVar5.m_data = (mimeType->d).ptr, QVar5.m_size = 0x16,
       QVar8.m_data = "application/x-qt-image", QVar8.m_size = 0x16,
       cVar1 = QtPrivate::equalStrings(QVar5,QVar8), cVar1 != '\0')) {
      local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      QImageWriter::supportedImageFormats();
      imageMimeFormats((QStringList *)&local_58,(QList<QByteArray> *)&local_40);
      QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_40);
      if ((undefined1 *)local_58.size == (undefined1 *)0x0) {
        cVar2 = '\0';
      }
      else {
        lVar3 = 0;
        puVar4 = (undefined1 *)0x0;
        do {
          cVar2 = (**(code **)(*(long *)data + 0x60))
                            (data,(undefined1 *)((long)&((local_58.ptr)->d).d + lVar3));
          if (cVar2 != '\0') break;
          puVar4 = puVar4 + 1;
          lVar3 = lVar3 + 0x18;
        } while (puVar4 < (ulong)local_58.size);
      }
    }
    else {
      QVar6.m_data = &DAT_00000006;
      QVar6.m_size = (qsizetype)mimeType;
      cVar1 = QString::startsWith(QVar6,0x679058);
      if ((cVar1 == '\0') || (cVar1 = QMimeData::hasImage(), cVar1 == '\0')) {
        cVar2 = '\0';
        goto LAB_002eb8e4;
      }
      QImageWriter::supportedImageFormats();
      imageMimeFormats((QStringList *)&local_58,(QList<QByteArray> *)&local_40);
      QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_40);
      QVar7.m_data = (mimeType->d).ptr;
      QVar7.m_size = (mimeType->d).size;
      cVar2 = QtPrivate::QStringList_contains((QList_conflict *)&local_58,QVar7,CaseSensitive);
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  }
LAB_002eb8e4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return (bool)cVar2;
}

Assistant:

bool QInternalMimeData::hasFormatHelper(const QString &mimeType, const QMimeData *data)
{

    bool foundFormat = data->hasFormat(mimeType);
    if (!foundFormat) {
        if (mimeType == "application/x-qt-image"_L1) {
            // check all supported image formats
            QStringList imageFormats = imageWriteMimeFormats();
            for (int i = 0; i < imageFormats.size(); ++i) {
                if ((foundFormat = data->hasFormat(imageFormats.at(i))))
                    break;
            }
        } else if (mimeType.startsWith("image/"_L1)) {
            return data->hasImage() && imageWriteMimeFormats().contains(mimeType);
        }
    }
    return foundFormat;
}